

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O2

void copyFile(string *filepath,string *dirpath)

{
  char *__s2;
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  undefined1 *puVar6;
  char *__s1;
  string filecontent;
  string filename;
  string local_1a58;
  string local_1a38;
  string local_1a18;
  string local_19f8;
  char *local_19d8;
  long local_19d0;
  char *local_19b8;
  long local_19b0;
  char *local_1998;
  long local_1990;
  char *local_1978;
  long local_1970;
  char *local_1958;
  long local_1950;
  undefined8 auStack_1948 [2];
  string names1 [100];
  string names2 [100];
  
  lVar4 = 0x10;
  do {
    puVar6 = (undefined1 *)((long)&names1[0]._M_dataplus._M_p + lVar4);
    *(undefined1 **)((long)auStack_1948 + lVar4) = puVar6;
    *(undefined8 *)((long)auStack_1948 + lVar4 + 8) = 0;
    *puVar6 = 0;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0xc90);
  std::__cxx11::string::string((string *)&local_1a38,(string *)filepath);
  iVar1 = parsePath(&local_1a38,names1);
  std::__cxx11::string::~string((string *)&local_1a38);
  std::__cxx11::string::string((string *)&local_1958,(string *)filepath);
  iVar2 = doesExist(names1,iVar1,local_1950 == 0 || *local_1958 != '/');
  std::__cxx11::string::~string((string *)&local_1958);
  if (iVar1 == iVar2) {
    std::__cxx11::string::string((string *)&local_1978,(string *)filepath);
    iVar2 = getId(names1,iVar1,local_1970 == 0 || *local_1978 != '/');
    std::__cxx11::string::~string((string *)&local_1978);
    if (inodes[iVar2].i_mode == 1) {
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)filepath);
      poVar5 = std::operator<<(poVar5," is not a file.");
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      lVar4 = 0x10;
      do {
        puVar6 = (undefined1 *)((long)&names2[0]._M_dataplus._M_p + lVar4);
        *(undefined1 **)((long)&names1[99].field_2 + lVar4) = puVar6;
        *(undefined8 *)((long)&names1[99].field_2 + lVar4 + 8) = 0;
        *puVar6 = 0;
        lVar4 = lVar4 + 0x20;
      } while (lVar4 != 0xc90);
      std::__cxx11::string::string((string *)&local_1a58,(string *)dirpath);
      iVar2 = parsePath(&local_1a58,names2);
      std::__cxx11::string::~string((string *)&local_1a58);
      std::__cxx11::string::string((string *)&local_1998,(string *)dirpath);
      iVar3 = doesExist(names2,iVar2,local_1990 == 0 || *local_1998 != '/');
      std::__cxx11::string::~string((string *)&local_1998);
      if (iVar2 == iVar3) {
        std::__cxx11::string::string((string *)&local_19b8,(string *)dirpath);
        iVar2 = getId(names2,iVar2,local_19b0 == 0 || *local_19b8 != '/');
        std::__cxx11::string::~string((string *)&local_19b8);
        std::__cxx11::string::string((string *)&local_19d8,(string *)filepath);
        iVar3 = getId(names1,iVar1 + -1,local_19d0 == 0 || *local_19d8 != '/');
        std::__cxx11::string::~string((string *)&local_19d8);
        if (inodes[iVar2].i_mode == 2) {
          poVar5 = std::operator<<((ostream *)&std::cout,(string *)dirpath);
          std::operator<<(poVar5," is not a folder.\n");
        }
        else if (iVar2 == iVar3) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Invalid path.");
          std::endl<char,std::char_traits<char>>(poVar5);
        }
        else {
          filename._M_dataplus._M_p = (pointer)&filename.field_2;
          filename._M_string_length = 0;
          filename.field_2._M_local_buf[0] = '\0';
          filecontent._M_dataplus._M_p = (pointer)&filecontent.field_2;
          filecontent._M_string_length = 0;
          filecontent.field_2._M_local_buf[0] = '\0';
          iVar3 = inodes[iVar3].i_blocks[0];
          std::__cxx11::string::assign((char *)&filecontent);
          __s2 = names1[iVar1 + -1]._M_dataplus._M_p;
          lVar4 = 0;
          __s1 = emptyspaces + (long)iVar3 * 0x1000 + 0x200;
          do {
            lVar4 = lVar4 + -0x100;
            if (lVar4 == -0xf00) goto LAB_0010445f;
            iVar1 = strcmp(__s1,__s2);
            __s1 = __s1 + 0x100;
          } while (iVar1 != 0);
          std::__cxx11::string::assign((char *)&filename);
LAB_0010445f:
          std::__cxx11::string::string((string *)&local_1a18,(string *)&filename);
          std::__cxx11::string::string((string *)&local_19f8,(string *)&filecontent);
          iVar1 = makeFileById(iVar2,&local_1a18,&local_19f8);
          std::__cxx11::string::~string((string *)&local_19f8);
          std::__cxx11::string::~string((string *)&local_1a18);
          if (iVar1 == 0) {
            poVar5 = std::operator<<((ostream *)&std::cout,"current folder is full!");
            std::endl<char,std::char_traits<char>>(poVar5);
          }
          std::__cxx11::string::~string((string *)&filecontent);
          std::__cxx11::string::~string((string *)&filename);
        }
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cout,"Invalid path.");
        std::endl<char,std::char_traits<char>>(poVar5);
      }
      lVar4 = 0xc60;
      do {
        std::__cxx11::string::~string((string *)((long)&names2[0]._M_dataplus._M_p + lVar4));
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != -0x20);
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Invalid path.");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  lVar4 = 0xc60;
  do {
    std::__cxx11::string::~string((string *)((long)&names1[0]._M_dataplus._M_p + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  return;
}

Assistant:

void copyFile(string filepath, string dirpath) {
    string names1[100];
    int layers1 = parsePath(filepath, names1);
    int legal_layers1 = doesExist(names1, layers1, getPathType(filepath) == RELATIVE_PATH);
    if (layers1 == legal_layers1) {
        int id1 = getId(names1, layers1, getPathType(filepath) == RELATIVE_PATH);
        if (inodes[id1].i_mode == A_FOLDER) {
            setColor(COLOR_ERR);
            cout << filepath << " is not a file." << endl;
            setColor(COLOR_ORIGIN);
        }
        else {
            string names2[100];
            int layers2 = parsePath(dirpath, names2);
            int legal_layers2 = doesExist(names2, layers2, getPathType(dirpath) == RELATIVE_PATH);
            if (layers2 == legal_layers2) {//dirpath合法
                int id2 = getId(names2, layers2, getPathType(dirpath) == RELATIVE_PATH);
                int id3 = getId(names1, layers1 - 1, getPathType(filepath) == RELATIVE_PATH);
                if (inodes[id2].i_mode == A_FILE) {
                    setColor(COLOR_ERR);
                    cout << dirpath << " is not a folder.\n";
                    setColor(COLOR_ORIGIN);
                }
                else if (id2 == id3) {//若是需拷贝文件所在的目录
                    setColor(COLOR_ERR);
                    cout << "Invalid path." << endl;
                    setColor(COLOR_ORIGIN);
                }
                else {//完全合法
                    string filename, filecontent;
                    File_Block *p = getAddressByLocation_File(inodes[id1].i_blocks[0]);
                    dir_block *q = getAddressByLocation_Folder(inodes[id3].i_blocks[0]);
                    filecontent = p->data;
                    for (int i = 2; i < 16; i++) {
                        if (strcmp(q->dirs[i].name, names1[layers1 - 1].c_str()) == 0) {
                            filename = q->dirs[i].name;
                            break;
                        }
                    }
                    if(makeFileById(id2, filename, filecontent) == 0){
                        cout << "current folder is full!" << endl;
                        return;
                    }
                }
            }
            else {
                setColor(COLOR_ERR);
                cout << "Invalid path." << endl;
                setColor(COLOR_ORIGIN);
            }
        }
    }
    else {
        setColor(COLOR_ERR);
        cout << "Invalid path." << endl;

    }
}